

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O2

Offset<Movie> CreateMovie(FlatBufferBuilder *_fbb,MovieT *_o,rehasher_function_t *_rehasher)

{
  Character main_character_type;
  Offset<void> main_character;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> characters_type;
  Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_> characters;
  Offset<Movie> OVar1;
  long lVar2;
  _VectorArgs _va;
  FlatBufferBuilder *local_48;
  MovieT *local_40;
  rehasher_function_t *local_38;
  
  main_character_type = (_o->main_character).type;
  characters.o = 0;
  local_48 = _fbb;
  local_40 = _o;
  local_38 = _rehasher;
  main_character = CharacterUnion::Pack(&_o->main_character,_fbb,(rehasher_function_t *)0x0);
  lVar2 = (long)(_o->characters).super__Vector_base<CharacterUnion,_std::allocator<CharacterUnion>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->characters).super__Vector_base<CharacterUnion,_std::allocator<CharacterUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 == 0) {
    characters_type.o = 0;
  }
  else {
    characters_type =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<unsigned_char,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_1_,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,lVar2 >> 4,&local_48);
    lVar2 = (long)(_o->characters).
                  super__Vector_base<CharacterUnion,_std::allocator<CharacterUnion>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(_o->characters).
                  super__Vector_base<CharacterUnion,_std::allocator<CharacterUnion>_>._M_impl.
                  super__Vector_impl_data._M_start;
    characters.o = 0;
    if (lVar2 != 0) {
      characters = flatbuffers::FlatBufferBuilderImpl<false>::
                   CreateVector<flatbuffers::Offset<void>,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_2_,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                             (_fbb,lVar2 >> 4,&local_48);
    }
  }
  OVar1 = CreateMovie(_fbb,main_character_type,main_character,characters_type,characters);
  return (Offset<Movie>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Movie> CreateMovie(::flatbuffers::FlatBufferBuilder &_fbb, const MovieT *_o, const ::flatbuffers::rehasher_function_t *_rehasher) {
  (void)_rehasher;
  (void)_o;
  struct _VectorArgs { ::flatbuffers::FlatBufferBuilder *__fbb; const MovieT* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;
  auto _main_character_type = _o->main_character.type;
  auto _main_character = _o->main_character.Pack(_fbb);
  auto _characters_type = _o->characters.size() ? _fbb.CreateVector<uint8_t>(_o->characters.size(), [](size_t i, _VectorArgs *__va) { return static_cast<uint8_t>(__va->__o->characters[i].type); }, &_va) : 0;
  auto _characters = _o->characters.size() ? _fbb.CreateVector<::flatbuffers::Offset<void>>(_o->characters.size(), [](size_t i, _VectorArgs *__va) { return __va->__o->characters[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va) : 0;
  return CreateMovie(
      _fbb,
      _main_character_type,
      _main_character,
      _characters_type,
      _characters);
}